

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O2

void __thiscall rengine::SignalEmitter::~SignalEmitter(SignalEmitter *this)

{
  _Vector_base<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  *this_00;
  
  this->_vptr_SignalEmitter = (_func_int **)&PTR__SignalEmitter_001159d8;
  Signal<>::emit(&onDestruction,this);
  this_00 = &this->m_buckets->
             super__Vector_base<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  ;
  if (this_00 !=
      (_Vector_base<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
       *)0x0) {
    std::
    _Vector_base<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
    ::~_Vector_base(this_00);
  }
  operator_delete(this_00);
  return;
}

Assistant:

SignalEmitter::~SignalEmitter()
{
    onDestruction.emit(this);
    delete m_buckets;
}